

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

void __thiscall
icu_63::UnifiedCache::_fetch
          (UnifiedCache *this,UHashElement *element,SharedObject **value,UErrorCode *status)

{
  CacheKeyBase *theKey;
  UErrorCode *status_local;
  SharedObject **value_local;
  UHashElement *element_local;
  UnifiedCache *this_local;
  
  *status = *(UErrorCode *)((long)(element->key).pointer + 8);
  removeHardRef(this,*value);
  *value = (SharedObject *)element->value;
  addHardRef(this,*value);
  return;
}

Assistant:

void UnifiedCache::_fetch(
        const UHashElement *element,
        const SharedObject *&value,
        UErrorCode &status) const {
    const CacheKeyBase *theKey = (const CacheKeyBase *) element->key.pointer;
    status = theKey->fCreationStatus;

    // Since we have the cache lock, calling regular SharedObject add/removeRef
    // could cause us to deadlock on ourselves since they may need to lock
    // the cache mutex.
    removeHardRef(value);
    value = static_cast<const SharedObject *>(element->value.pointer);
    addHardRef(value);
}